

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_8_0_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined2 uVar1;
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  long lVar40;
  bool bVar41;
  undefined2 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined8 uVar128;
  undefined8 uVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  short sStack_114;
  
  bVar41 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar33 = (long)dir;
  lVar25 = (long)cdef_directions_padded[lVar33 + 2][0];
  lVar26 = (long)cdef_directions_padded[lVar33 + 2][1];
  lVar27 = (long)cdef_directions_padded[lVar33 + 4][0];
  lVar29 = (long)cdef_directions_padded[lVar33 + 4][1];
  lVar37 = (long)cdef_directions_padded[lVar33][0];
  lVar33 = (long)cdef_directions_padded[lVar33][1];
  uVar42 = (undefined2)pri_strength;
  auVar48._0_2_ = (undefined2)sec_strength;
  if (block_width == 8) {
    uVar32 = pri_damping;
    if (pri_strength != 0) {
      iVar2 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar32 = pri_damping - iVar2;
      if (pri_damping < iVar2) {
        uVar32 = 0;
      }
    }
    uVar39 = sec_damping;
    if (sec_strength != 0) {
      iVar2 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar39 = sec_damping - iVar2;
      if (sec_damping < iVar2) {
        uVar39 = 0;
      }
    }
    auVar43 = ZEXT416(uVar39);
    for (lVar31 = 0; lVar31 < block_height; lVar31 = lVar31 + 2) {
      auVar126 = ZEXT116(0) * *(undefined1 (*) [16])in +
                 ZEXT116(1) * *(undefined1 (*) [16])((long)in + 0x120);
      auVar44 = ZEXT116(1) * *(undefined1 (*) [16])in;
      uVar128 = auVar44._0_8_;
      uVar129 = auVar44._8_8_;
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar25 * 2));
      auVar45 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar25 * 2));
      auVar57._16_16_ = auVar44;
      auVar57._0_16_ = auVar45;
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar25 * -2));
      auVar45 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar25 * -2 + 0x120));
      auVar82._16_16_ = auVar44;
      auVar82._0_16_ = auVar45;
      auVar3._16_8_ = uVar128;
      auVar3._0_16_ = auVar126;
      auVar3._24_8_ = uVar129;
      auVar47 = vpsubw_avx2(auVar57,auVar3);
      auVar94 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar127 = ZEXT416(uVar32);
      auVar3 = vpsrlw_avx2(auVar47,auVar127);
      auVar23._2_2_ = uVar42;
      auVar23._0_2_ = uVar42;
      auVar23._4_2_ = uVar42;
      auVar23._6_2_ = uVar42;
      auVar23._8_2_ = uVar42;
      auVar23._10_2_ = uVar42;
      auVar23._12_2_ = uVar42;
      auVar23._14_2_ = uVar42;
      auVar23._16_2_ = uVar42;
      auVar23._18_2_ = uVar42;
      auVar23._20_2_ = uVar42;
      auVar23._22_2_ = uVar42;
      auVar23._24_2_ = uVar42;
      auVar23._26_2_ = uVar42;
      auVar23._28_2_ = uVar42;
      auVar23._30_2_ = uVar42;
      auVar3 = vpsubusw_avx2(auVar23,auVar3);
      auVar47 = vpminsw_avx2(auVar3,auVar47);
      auVar3 = vpaddw_avx2(auVar47,auVar94);
      auVar5._16_8_ = uVar128;
      auVar5._0_16_ = auVar126;
      auVar5._24_8_ = uVar129;
      auVar95 = vpsubw_avx2(auVar82,auVar5);
      auVar47 = vpabsw_avx2(auVar95);
      auVar4 = vpsrlw_avx2(auVar47,auVar127);
      auVar95 = vpsraw_avx2(auVar95,0xf);
      auVar4 = vpsubusw_avx2(auVar23,auVar4);
      auVar47 = vpminsw_avx2(auVar47,auVar4);
      auVar47 = vpaddw_avx2(auVar47,auVar95);
      auVar47 = vpaddw_avx2(auVar47 ^ auVar95,auVar3 ^ auVar94);
      uVar1 = (undefined2)cdef_pri_taps[bVar41][0];
      auVar96._2_2_ = uVar1;
      auVar96._0_2_ = uVar1;
      auVar96._4_2_ = uVar1;
      auVar96._6_2_ = uVar1;
      auVar96._8_2_ = uVar1;
      auVar96._10_2_ = uVar1;
      auVar96._12_2_ = uVar1;
      auVar96._14_2_ = uVar1;
      auVar96._16_2_ = uVar1;
      auVar96._18_2_ = uVar1;
      auVar96._20_2_ = uVar1;
      auVar96._22_2_ = uVar1;
      auVar96._24_2_ = uVar1;
      auVar96._26_2_ = uVar1;
      auVar96._28_2_ = uVar1;
      auVar96._30_2_ = uVar1;
      auVar4 = vpmullw_avx2(auVar47,auVar96);
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar26 * 2));
      auVar45 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar26 * 2));
      auVar97._16_16_ = auVar44;
      auVar97._0_16_ = auVar45;
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar26 * -2));
      auVar45 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar26 * -2 + 0x120));
      auVar106._16_16_ = auVar44;
      auVar106._0_16_ = auVar45;
      auVar6._16_8_ = uVar128;
      auVar6._0_16_ = auVar126;
      auVar6._24_8_ = uVar129;
      auVar47 = vpsubw_avx2(auVar97,auVar6);
      auVar118 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar3 = vpsrlw_avx2(auVar47,auVar127);
      auVar3 = vpsubusw_avx2(auVar23,auVar3);
      auVar47 = vpminsw_avx2(auVar47,auVar3);
      auVar3 = vpaddw_avx2(auVar47,auVar118);
      auVar7._16_8_ = uVar128;
      auVar7._0_16_ = auVar126;
      auVar7._24_8_ = uVar129;
      auVar94 = vpsubw_avx2(auVar106,auVar7);
      auVar47 = vpabsw_avx2(auVar94);
      auVar95 = vpsrlw_avx2(auVar47,auVar127);
      auVar94 = vpsraw_avx2(auVar94,0xf);
      auVar95 = vpsubusw_avx2(auVar23,auVar95);
      auVar47 = vpminsw_avx2(auVar47,auVar95);
      auVar47 = vpaddw_avx2(auVar47,auVar94);
      auVar47 = vpaddw_avx2(auVar47 ^ auVar94,auVar3 ^ auVar118);
      uVar1 = (undefined2)cdef_pri_taps[bVar41][1];
      auVar119._2_2_ = uVar1;
      auVar119._0_2_ = uVar1;
      auVar119._4_2_ = uVar1;
      auVar119._6_2_ = uVar1;
      auVar119._8_2_ = uVar1;
      auVar119._10_2_ = uVar1;
      auVar119._12_2_ = uVar1;
      auVar119._14_2_ = uVar1;
      auVar119._16_2_ = uVar1;
      auVar119._18_2_ = uVar1;
      auVar119._20_2_ = uVar1;
      auVar119._22_2_ = uVar1;
      auVar119._24_2_ = uVar1;
      auVar119._26_2_ = uVar1;
      auVar119._28_2_ = uVar1;
      auVar119._30_2_ = uVar1;
      auVar47 = vpmullw_avx2(auVar47,auVar119);
      auVar3 = vpaddw_avx2(auVar47,auVar4);
      auVar47 = vpmaxub_avx2(auVar57,auVar82);
      auVar4 = vpmaxub_avx2(auVar106,auVar97);
      auVar94 = vpmaxub_avx2(auVar47,auVar4);
      auVar47 = vpminsw_avx2(auVar57,auVar82);
      auVar47 = vpminsw_avx2(auVar47,auVar97);
      auVar118 = vpminsw_avx2(auVar106,auVar47);
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar27 * 2));
      auVar45 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar27 * 2));
      auVar46._16_16_ = auVar44;
      auVar46._0_16_ = auVar45;
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar27 * -2));
      auVar45 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar27 * -2 + 0x120));
      auVar122._16_16_ = auVar44;
      auVar122._0_16_ = auVar45;
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar37 * 2));
      auVar45 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar37 * 2));
      auVar124._16_16_ = auVar44;
      auVar124._0_16_ = auVar45;
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar37 * -2));
      auVar45 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar37 * -2 + 0x120));
      auVar120._16_16_ = auVar44;
      auVar120._0_16_ = auVar45;
      auVar8._16_8_ = uVar128;
      auVar8._0_16_ = auVar126;
      auVar8._24_8_ = uVar129;
      auVar95 = vpsubw_avx2(auVar46,auVar8);
      auVar47 = vpabsw_avx2(auVar95);
      auVar4 = vpsrlw_avx2(auVar47,auVar43);
      auVar58 = vpsraw_avx2(auVar95,0xf);
      auVar22._2_2_ = auVar48._0_2_;
      auVar22._0_2_ = auVar48._0_2_;
      auVar22._4_2_ = auVar48._0_2_;
      auVar22._6_2_ = auVar48._0_2_;
      auVar22._8_2_ = auVar48._0_2_;
      auVar22._10_2_ = auVar48._0_2_;
      auVar22._12_2_ = auVar48._0_2_;
      auVar22._14_2_ = auVar48._0_2_;
      auVar22._16_2_ = auVar48._0_2_;
      auVar22._18_2_ = auVar48._0_2_;
      auVar22._20_2_ = auVar48._0_2_;
      auVar22._22_2_ = auVar48._0_2_;
      auVar22._24_2_ = auVar48._0_2_;
      auVar22._26_2_ = auVar48._0_2_;
      auVar22._28_2_ = auVar48._0_2_;
      auVar22._30_2_ = auVar48._0_2_;
      auVar4 = vpsubusw_avx2(auVar22,auVar4);
      auVar47 = vpminsw_avx2(auVar47,auVar4);
      auVar4 = vpaddw_avx2(auVar47,auVar58);
      auVar9._16_8_ = uVar128;
      auVar9._0_16_ = auVar126;
      auVar9._24_8_ = uVar129;
      auVar47 = vpsubw_avx2(auVar122,auVar9);
      auVar98 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar95 = vpsrlw_avx2(auVar47,auVar43);
      auVar95 = vpsubusw_avx2(auVar22,auVar95);
      auVar47 = vpminsw_avx2(auVar95,auVar47);
      auVar47 = vpaddw_avx2(auVar47,auVar98);
      auVar4 = vpaddw_avx2(auVar47 ^ auVar98,auVar4 ^ auVar58);
      auVar10._16_8_ = uVar128;
      auVar10._0_16_ = auVar126;
      auVar10._24_8_ = uVar129;
      auVar47 = vpsubw_avx2(auVar124,auVar10);
      auVar99 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar95 = vpsrlw_avx2(auVar47,auVar43);
      auVar95 = vpsubusw_avx2(auVar22,auVar95);
      auVar47 = vpminsw_avx2(auVar95,auVar47);
      auVar95 = vpaddw_avx2(auVar47,auVar99);
      auVar11._16_8_ = uVar128;
      auVar11._0_16_ = auVar126;
      auVar11._24_8_ = uVar129;
      auVar98 = vpsubw_avx2(auVar120,auVar11);
      auVar47 = vpabsw_avx2(auVar98);
      auVar58 = vpsrlw_avx2(auVar47,auVar43);
      auVar98 = vpsraw_avx2(auVar98,0xf);
      auVar58 = vpsubusw_avx2(auVar22,auVar58);
      auVar47 = vpminsw_avx2(auVar47,auVar58);
      auVar47 = vpaddw_avx2(auVar47,auVar98);
      auVar47 = vpaddw_avx2(auVar95 ^ auVar99,auVar47 ^ auVar98);
      auVar47 = vpaddw_avx2(auVar4,auVar47);
      auVar21._8_2_ = 2;
      auVar21._0_8_ = 0x2000200020002;
      auVar21._10_2_ = 2;
      auVar21._12_2_ = 2;
      auVar21._14_2_ = 2;
      auVar21._16_2_ = 2;
      auVar21._18_2_ = 2;
      auVar21._20_2_ = 2;
      auVar21._22_2_ = 2;
      auVar21._24_2_ = 2;
      auVar21._26_2_ = 2;
      auVar21._28_2_ = 2;
      auVar21._30_2_ = 2;
      auVar47 = vpmullw_avx2(auVar47,auVar21);
      auVar3 = vpaddw_avx2(auVar3,auVar47);
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar29 * 2));
      auVar45 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar29 * 2));
      auVar131._16_16_ = auVar44;
      auVar131._0_16_ = auVar45;
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar29 * -2));
      auVar45 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar29 * -2 + 0x120));
      auVar49._16_16_ = auVar44;
      auVar49._0_16_ = auVar45;
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar33 * 2));
      auVar45 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar33 * 2));
      auVar59._16_16_ = auVar44;
      auVar59._0_16_ = auVar45;
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar33 * -2));
      auVar45 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar33 * -2 + 0x120));
      auVar100._16_16_ = auVar44;
      auVar100._0_16_ = auVar45;
      auVar12._16_8_ = uVar128;
      auVar12._0_16_ = auVar126;
      auVar12._24_8_ = uVar129;
      auVar47 = vpsubw_avx2(auVar131,auVar12);
      auVar58 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar4 = vpsrlw_avx2(auVar47,auVar43);
      auVar4 = vpsubusw_avx2(auVar22,auVar4);
      auVar47 = vpminsw_avx2(auVar4,auVar47);
      auVar4 = vpaddw_avx2(auVar47,auVar58);
      auVar13._16_8_ = uVar128;
      auVar13._0_16_ = auVar126;
      auVar13._24_8_ = uVar129;
      auVar47 = vpsubw_avx2(auVar49,auVar13);
      auVar98 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar95 = vpsrlw_avx2(auVar47,auVar43);
      auVar95 = vpsubusw_avx2(auVar22,auVar95);
      auVar47 = vpminsw_avx2(auVar95,auVar47);
      auVar47 = vpaddw_avx2(auVar98,auVar47);
      auVar4 = vpaddw_avx2(auVar98 ^ auVar47,auVar4 ^ auVar58);
      auVar14._16_8_ = uVar128;
      auVar14._0_16_ = auVar126;
      auVar14._24_8_ = uVar129;
      auVar58 = vpsubw_avx2(auVar59,auVar14);
      auVar47 = vpabsw_avx2(auVar58);
      auVar95 = vpsrlw_avx2(auVar47,auVar43);
      auVar99 = vpsraw_avx2(auVar58,0xf);
      auVar95 = vpsubusw_avx2(auVar22,auVar95);
      auVar47 = vpminsw_avx2(auVar47,auVar95);
      auVar95 = vpaddw_avx2(auVar47,auVar99);
      auVar15._16_8_ = uVar128;
      auVar15._0_16_ = auVar126;
      auVar15._24_8_ = uVar129;
      auVar98 = vpsubw_avx2(auVar100,auVar15);
      auVar47 = vpabsw_avx2(auVar98);
      auVar58 = vpsrlw_avx2(auVar47,auVar43);
      auVar58 = vpsubusw_avx2(auVar22,auVar58);
      auVar47 = vpminsw_avx2(auVar47,auVar58);
      auVar58 = vpsraw_avx2(auVar98,0xf);
      auVar47 = vpaddw_avx2(auVar47,auVar58);
      auVar47 = vpaddw_avx2(auVar95 ^ auVar99,auVar47 ^ auVar58);
      auVar47 = vpaddw_avx2(auVar4,auVar47);
      auVar20._8_2_ = 1;
      auVar20._0_8_ = 0x1000100010001;
      auVar20._10_2_ = 1;
      auVar20._12_2_ = 1;
      auVar20._14_2_ = 1;
      auVar20._16_2_ = 1;
      auVar20._18_2_ = 1;
      auVar20._20_2_ = 1;
      auVar20._22_2_ = 1;
      auVar20._24_2_ = 1;
      auVar20._26_2_ = 1;
      auVar20._28_2_ = 1;
      auVar20._30_2_ = 1;
      auVar47 = vpmullw_avx2(auVar47,auVar20);
      auVar47 = vpaddw_avx2(auVar47,auVar3);
      auVar3 = vpmaxub_avx2(auVar122,auVar46);
      auVar4 = vpmaxub_avx2(auVar124,auVar120);
      auVar3 = vpmaxub_avx2(auVar3,auVar4);
      auVar4 = vpmaxub_avx2(auVar131,auVar49);
      auVar4 = vpmaxub_avx2(auVar4,auVar59);
      auVar4 = vpmaxub_avx2(auVar3,auVar4);
      auVar19._8_2_ = 0xbfff;
      auVar19._0_8_ = 0xbfffbfffbfffbfff;
      auVar19._10_2_ = 0xbfff;
      auVar19._12_2_ = 0xbfff;
      auVar19._14_2_ = 0xbfff;
      auVar19._16_2_ = 0xbfff;
      auVar19._18_2_ = 0xbfff;
      auVar19._20_2_ = 0xbfff;
      auVar19._22_2_ = 0xbfff;
      auVar19._24_2_ = 0xbfff;
      auVar19._26_2_ = 0xbfff;
      auVar19._28_2_ = 0xbfff;
      auVar19._30_2_ = 0xbfff;
      auVar3 = vpand_avx2(auVar19,auVar94);
      auVar4 = vpmaxub_avx2(auVar4,auVar100);
      auVar4 = vpand_avx2(auVar4,auVar19);
      auVar3 = vpmaxsw_avx2(auVar3,auVar4);
      auVar4 = vpminsw_avx2(auVar46,auVar118);
      auVar4 = vpminsw_avx2(auVar122,auVar4);
      auVar4 = vpminsw_avx2(auVar124,auVar4);
      auVar4 = vpminsw_avx2(auVar120,auVar4);
      auVar95 = vpminsw_avx2(auVar131,auVar49);
      auVar95 = vpminsw_avx2(auVar95,auVar59);
      auVar95 = vpminsw_avx2(auVar95,auVar100);
      auVar16._16_8_ = uVar128;
      auVar16._0_16_ = auVar126;
      auVar16._24_8_ = uVar129;
      auVar4 = vpminsw_avx2(auVar16,auVar4);
      auVar4 = vpminsw_avx2(auVar4,auVar95);
      auVar95 = vpsraw_avx2(auVar47,0xf);
      auVar24._8_2_ = 8;
      auVar24._0_8_ = 0x8000800080008;
      auVar24._10_2_ = 8;
      auVar24._12_2_ = 8;
      auVar24._14_2_ = 8;
      auVar24._16_2_ = 8;
      auVar24._18_2_ = 8;
      auVar24._20_2_ = 8;
      auVar24._22_2_ = 8;
      auVar24._24_2_ = 8;
      auVar24._26_2_ = 8;
      auVar24._28_2_ = 8;
      auVar24._30_2_ = 8;
      auVar47 = vpaddw_avx2(auVar47,auVar24);
      auVar47 = vpaddw_avx2(auVar47,auVar95);
      auVar17._16_8_ = uVar128;
      auVar17._0_16_ = auVar126;
      auVar17._24_8_ = uVar129;
      auVar3 = vpmaxsw_avx2(auVar17,auVar3);
      auVar47 = vpsraw_avx2(auVar47,4);
      auVar18._16_8_ = uVar128;
      auVar18._0_16_ = auVar126;
      auVar18._24_8_ = uVar129;
      auVar47 = vpaddw_avx2(auVar18,auVar47);
      auVar47 = vpmaxsw_avx2(auVar47,auVar4);
      auVar47 = vpminsw_avx2(auVar47,auVar3);
      auVar47 = vpackuswb_avx2(auVar47,auVar47);
      *(long *)dest = auVar47._16_8_;
      *(long *)((long)dest + (long)dstride) = auVar47._0_8_;
      dest = (void *)((long)dest + (long)dstride * 2);
      in = (uint16_t *)((long)in + 0x240);
    }
  }
  else {
    uVar32 = pri_damping;
    if (pri_strength != 0) {
      iVar2 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar32 = pri_damping - iVar2;
      if (pri_damping < iVar2) {
        uVar32 = 0;
      }
    }
    uVar39 = sec_damping;
    if (sec_strength != 0) {
      iVar2 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar39 = sec_damping - iVar2;
      if (sec_damping < iVar2) {
        uVar39 = 0;
      }
    }
    auVar48._2_2_ = auVar48._0_2_;
    auVar48._4_2_ = auVar48._0_2_;
    auVar48._6_2_ = auVar48._0_2_;
    auVar48._8_2_ = auVar48._0_2_;
    auVar48._10_2_ = auVar48._0_2_;
    auVar48._12_2_ = auVar48._0_2_;
    auVar48._14_2_ = auVar48._0_2_;
    auVar48._16_2_ = auVar48._0_2_;
    auVar48._18_2_ = auVar48._0_2_;
    auVar48._20_2_ = auVar48._0_2_;
    auVar48._22_2_ = auVar48._0_2_;
    auVar48._24_2_ = auVar48._0_2_;
    auVar48._26_2_ = auVar48._0_2_;
    auVar48._28_2_ = auVar48._0_2_;
    auVar48._30_2_ = auVar48._0_2_;
    sStack_114 = (short)(block_height >> 0x1f);
    lVar31 = (long)dstride;
    lVar38 = lVar33 * -2;
    lVar30 = lVar29 * -2;
    lVar40 = lVar37 * -2;
    lVar36 = lVar27 * -2;
    lVar35 = lVar26 * -2;
    lVar34 = lVar25 * -2;
    for (lVar28 = 0; lVar28 < CONCAT26(sStack_114,(int6)block_height); lVar28 = lVar28 + 4) {
      auVar43._8_8_ = 0;
      auVar43._0_8_ = *(ulong *)in;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = *(ulong *)((long)in + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar50,auVar43);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *(ulong *)((long)in + 0x240);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *(ulong *)((long)in + 0x360);
      auVar44 = vpunpcklqdq_avx(auVar61,auVar51);
      auVar102._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar102._16_16_ = ZEXT116(1) * auVar43;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)((long)in + lVar25 * 2);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = *(ulong *)((long)in + lVar25 * 2 + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar52,auVar44);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(ulong *)((long)in + lVar25 * 2 + 0x240);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = *(ulong *)((long)in + lVar25 * 2 + 0x360);
      auVar44 = vpunpcklqdq_avx(auVar62,auVar53);
      auVar113._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar113._16_16_ = ZEXT116(1) * auVar43;
      auVar47 = vpsubw_avx2(auVar113,auVar102);
      auVar95 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar45 = ZEXT416(uVar32);
      auVar3 = vpsrlw_avx2(auVar47,auVar45);
      auVar118._2_2_ = uVar42;
      auVar118._0_2_ = uVar42;
      auVar118._4_2_ = uVar42;
      auVar118._6_2_ = uVar42;
      auVar118._8_2_ = uVar42;
      auVar118._10_2_ = uVar42;
      auVar118._12_2_ = uVar42;
      auVar118._14_2_ = uVar42;
      auVar118._16_2_ = uVar42;
      auVar118._18_2_ = uVar42;
      auVar118._20_2_ = uVar42;
      auVar118._22_2_ = uVar42;
      auVar118._24_2_ = uVar42;
      auVar118._26_2_ = uVar42;
      auVar118._28_2_ = uVar42;
      auVar118._30_2_ = uVar42;
      auVar3 = vpsubusw_avx2(auVar118,auVar3);
      auVar47 = vpminsw_avx2(auVar47,auVar3);
      auVar3 = vpaddw_avx2(auVar47,auVar95);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)((long)in + lVar34);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = *(ulong *)((long)in + lVar34 + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar63,auVar54);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = *(ulong *)((long)in + lVar34 + 0x240);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = *(ulong *)((long)in + lVar34 + 0x360);
      auVar44 = vpunpcklqdq_avx(auVar70,auVar64);
      auVar69._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar69._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
      auVar47 = vpsubw_avx2(auVar69,auVar102);
      auVar94 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar4 = vpsrlw_avx2(auVar47,auVar45);
      auVar4 = vpsubusw_avx2(auVar118,auVar4);
      auVar47 = vpminsw_avx2(auVar47,auVar4);
      auVar47 = vpaddw_avx2(auVar47,auVar94);
      uVar1 = (undefined2)cdef_pri_taps[bVar41][0];
      auVar83._2_2_ = uVar1;
      auVar83._0_2_ = uVar1;
      auVar83._4_2_ = uVar1;
      auVar83._6_2_ = uVar1;
      auVar83._8_2_ = uVar1;
      auVar83._10_2_ = uVar1;
      auVar83._12_2_ = uVar1;
      auVar83._14_2_ = uVar1;
      auVar83._16_2_ = uVar1;
      auVar83._18_2_ = uVar1;
      auVar83._20_2_ = uVar1;
      auVar83._22_2_ = uVar1;
      auVar83._24_2_ = uVar1;
      auVar83._26_2_ = uVar1;
      auVar83._28_2_ = uVar1;
      auVar83._30_2_ = uVar1;
      auVar47 = vpaddw_avx2(auVar47 ^ auVar94,auVar3 ^ auVar95);
      auVar4 = vpmullw_avx2(auVar47,auVar83);
      auVar127._8_8_ = 0;
      auVar127._0_8_ = *(ulong *)((long)in + lVar26 * 2);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = *(ulong *)((long)in + lVar26 * 2 + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar71,auVar127);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *(ulong *)((long)in + lVar26 * 2 + 0x240);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = *(ulong *)((long)in + lVar26 * 2 + 0x360);
      auVar44 = vpunpcklqdq_avx(auVar86,auVar72);
      auVar84._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar84._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
      auVar47 = vpsubw_avx2(auVar84,auVar102);
      auVar94 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar3 = vpsrlw_avx2(auVar47,auVar45);
      auVar3 = vpsubusw_avx2(auVar118,auVar3);
      auVar47 = vpminsw_avx2(auVar3,auVar47);
      auVar3 = vpaddw_avx2(auVar47,auVar94);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = *(ulong *)((long)in + lVar35);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = *(ulong *)((long)in + lVar35 + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar103,auVar87);
      auVar104._8_8_ = 0;
      auVar104._0_8_ = *(ulong *)((long)in + lVar35 + 0x240);
      auVar114._8_8_ = 0;
      auVar114._0_8_ = *(ulong *)((long)in + lVar35 + 0x360);
      auVar44 = vpunpcklqdq_avx(auVar114,auVar104);
      auVar107._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar107._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
      auVar47 = vpsubw_avx2(auVar107,auVar102);
      auVar58 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar95 = vpsrlw_avx2(auVar47,auVar45);
      auVar95 = vpsubusw_avx2(auVar118,auVar95);
      auVar47 = vpminsw_avx2(auVar95,auVar47);
      auVar47 = vpaddw_avx2(auVar58,auVar47);
      uVar1 = (undefined2)cdef_pri_taps[bVar41][1];
      auVar121._2_2_ = uVar1;
      auVar121._0_2_ = uVar1;
      auVar121._4_2_ = uVar1;
      auVar121._6_2_ = uVar1;
      auVar121._8_2_ = uVar1;
      auVar121._10_2_ = uVar1;
      auVar121._12_2_ = uVar1;
      auVar121._14_2_ = uVar1;
      auVar121._16_2_ = uVar1;
      auVar121._18_2_ = uVar1;
      auVar121._20_2_ = uVar1;
      auVar121._22_2_ = uVar1;
      auVar121._24_2_ = uVar1;
      auVar121._26_2_ = uVar1;
      auVar121._28_2_ = uVar1;
      auVar121._30_2_ = uVar1;
      auVar47 = vpaddw_avx2(auVar58 ^ auVar47,auVar3 ^ auVar94);
      auVar47 = vpmullw_avx2(auVar121,auVar47);
      auVar3 = vpaddw_avx2(auVar47,auVar4);
      auVar47 = vpmaxub_avx2(auVar113,auVar69);
      auVar4 = vpmaxub_avx2(auVar107,auVar84);
      auVar94 = vpmaxub_avx2(auVar47,auVar4);
      auVar47 = vpminsw_avx2(auVar102,auVar113);
      auVar4 = vpminsw_avx2(auVar69,auVar84);
      auVar118 = vpminsw_avx2(auVar47,auVar4);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)((long)in + lVar27 * 2);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(ulong *)((long)in + lVar27 * 2 + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar65,auVar45);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = *(ulong *)((long)in + lVar27 * 2 + 0x240);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = *(ulong *)((long)in + lVar27 * 2 + 0x360);
      auVar44 = vpunpcklqdq_avx(auVar73,auVar66);
      auVar123._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar123._16_16_ = ZEXT116(1) * auVar43;
      auVar95 = vpsubw_avx2(auVar123,auVar102);
      auVar47 = vpabsw_avx2(auVar95);
      auVar4 = vpsrlw_avx2(auVar47,ZEXT416(uVar39));
      auVar98 = vpsraw_avx2(auVar95,0xf);
      auVar4 = vpsubusw_avx2(auVar48,auVar4);
      auVar47 = vpminsw_avx2(auVar47,auVar4);
      auVar4 = vpaddw_avx2(auVar47,auVar98);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = *(ulong *)((long)in + lVar36);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = *(ulong *)((long)in + lVar36 + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar74,auVar67);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = *(ulong *)((long)in + lVar36 + 0x240);
      auVar88._8_8_ = 0;
      auVar88._0_8_ = *(ulong *)((long)in + lVar36 + 0x360);
      auVar44 = vpunpcklqdq_avx(auVar88,auVar75);
      auVar125._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar125._16_16_ = ZEXT116(1) * auVar43;
      auVar58 = vpsubw_avx2(auVar125,auVar102);
      auVar47 = vpabsw_avx2(auVar58);
      auVar95 = vpsrlw_avx2(auVar47,ZEXT416(uVar39));
      auVar58 = vpsraw_avx2(auVar58,0xf);
      auVar95 = vpsubusw_avx2(auVar48,auVar95);
      auVar47 = vpminsw_avx2(auVar47,auVar95);
      auVar47 = vpaddw_avx2(auVar47,auVar58);
      auVar4 = vpaddw_avx2(auVar47 ^ auVar58,auVar4 ^ auVar98);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = *(ulong *)((long)in + lVar37 * 2);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = *(ulong *)((long)in + lVar37 * 2 + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar76,auVar68);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = *(ulong *)((long)in + lVar37 * 2 + 0x240);
      auVar89._8_8_ = 0;
      auVar89._0_8_ = *(ulong *)((long)in + lVar37 * 2 + 0x360);
      auVar44 = vpunpcklqdq_avx(auVar89,auVar77);
      auVar127 = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar43 = ZEXT116(1) * auVar43;
      uVar128 = auVar43._0_8_;
      uVar129 = auVar43._8_8_;
      auVar47._16_8_ = uVar128;
      auVar47._0_16_ = auVar127;
      auVar47._24_8_ = uVar129;
      auVar47 = vpsubw_avx2(auVar47,auVar102);
      auVar98 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar45 = ZEXT416(uVar39);
      auVar95 = vpsrlw_avx2(auVar47,auVar45);
      auVar95 = vpsubusw_avx2(auVar48,auVar95);
      auVar47 = vpminsw_avx2(auVar47,auVar95);
      auVar95 = vpaddw_avx2(auVar47,auVar98);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = *(ulong *)((long)in + lVar40);
      auVar90._8_8_ = 0;
      auVar90._0_8_ = *(ulong *)((long)in + lVar40 + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar90,auVar78);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = *(ulong *)((long)in + lVar40 + 0x240);
      auVar130._8_8_ = 0;
      auVar130._0_8_ = *(ulong *)((long)in + lVar40 + 0x360);
      auVar44 = vpunpcklqdq_avx(auVar130,auVar91);
      auVar132._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar132._16_16_ = ZEXT116(1) * auVar43;
      auVar47 = vpsubw_avx2(auVar132,auVar102);
      auVar99 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar58 = vpsrlw_avx2(auVar47,auVar45);
      auVar58 = vpsubusw_avx2(auVar48,auVar58);
      auVar47 = vpminsw_avx2(auVar58,auVar47);
      auVar47 = vpaddw_avx2(auVar47,auVar99);
      auVar47 = vpaddw_avx2(auVar95 ^ auVar98,auVar47 ^ auVar99);
      auVar47 = vpaddw_avx2(auVar4,auVar47);
      auVar99._8_2_ = 2;
      auVar99._0_8_ = 0x2000200020002;
      auVar99._10_2_ = 2;
      auVar99._12_2_ = 2;
      auVar99._14_2_ = 2;
      auVar99._16_2_ = 2;
      auVar99._18_2_ = 2;
      auVar99._20_2_ = 2;
      auVar99._22_2_ = 2;
      auVar99._24_2_ = 2;
      auVar99._26_2_ = 2;
      auVar99._28_2_ = 2;
      auVar99._30_2_ = 2;
      auVar47 = vpmullw_avx2(auVar47,auVar99);
      auVar3 = vpaddw_avx2(auVar3,auVar47);
      auVar126._8_8_ = 0;
      auVar126._0_8_ = *(ulong *)((long)in + lVar29 * 2);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *(ulong *)((long)in + lVar29 * 2 + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar55,auVar126);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = *(ulong *)((long)in + lVar29 * 2 + 0x240);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = *(ulong *)((long)in + lVar29 * 2 + 0x360);
      auVar44 = vpunpcklqdq_avx(auVar79,auVar56);
      auVar60._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
      auVar47 = vpsubw_avx2(auVar60,auVar102);
      auVar58 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar4 = vpsrlw_avx2(auVar47,auVar45);
      auVar4 = vpsubusw_avx2(auVar48,auVar4);
      auVar47 = vpminsw_avx2(auVar47,auVar4);
      auVar4 = vpaddw_avx2(auVar47,auVar58);
      auVar80._8_8_ = 0;
      auVar80._0_8_ = *(ulong *)((long)in + lVar30);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = *(ulong *)((long)in + lVar30 + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar92,auVar80);
      auVar93._8_8_ = 0;
      auVar93._0_8_ = *(ulong *)((long)in + lVar30 + 0x240);
      auVar109._8_8_ = 0;
      auVar109._0_8_ = *(ulong *)((long)in + lVar30 + 0x360);
      auVar44 = vpunpcklqdq_avx(auVar109,auVar93);
      auVar101._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar101._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
      auVar47 = vpsubw_avx2(auVar101,auVar102);
      auVar98 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar95 = vpsrlw_avx2(auVar47,auVar45);
      auVar95 = vpsubusw_avx2(auVar48,auVar95);
      auVar47 = vpminsw_avx2(auVar95,auVar47);
      auVar47 = vpaddw_avx2(auVar98,auVar47);
      auVar4 = vpaddw_avx2(auVar98 ^ auVar47,auVar4 ^ auVar58);
      auVar81._8_8_ = 0;
      auVar81._0_8_ = *(ulong *)((long)in + lVar33 * 2);
      auVar110._8_8_ = 0;
      auVar110._0_8_ = *(ulong *)((long)in + lVar33 * 2 + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar110,auVar81);
      auVar111._8_8_ = 0;
      auVar111._0_8_ = *(ulong *)((long)in + lVar33 * 2 + 0x240);
      auVar115._8_8_ = 0;
      auVar115._0_8_ = *(ulong *)((long)in + lVar33 * 2 + 0x360);
      auVar44 = vpunpcklqdq_avx(auVar115,auVar111);
      auVar85._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar85._16_16_ = ZEXT116(1) * auVar43;
      auVar47 = vpsubw_avx2(auVar85,auVar102);
      auVar99 = vpsraw_avx2(auVar47,0xf);
      auVar47 = vpabsw_avx2(auVar47);
      auVar95 = vpsrlw_avx2(auVar47,ZEXT416(uVar39));
      auVar95 = vpsubusw_avx2(auVar48,auVar95);
      auVar47 = vpminsw_avx2(auVar47,auVar95);
      auVar95 = vpaddw_avx2(auVar99,auVar47);
      auVar112._8_8_ = 0;
      auVar112._0_8_ = *(ulong *)((long)in + lVar38);
      auVar116._8_8_ = 0;
      auVar116._0_8_ = *(ulong *)((long)in + lVar38 + 0x120);
      auVar43 = vpunpcklqdq_avx(auVar116,auVar112);
      auVar105._8_8_ = 0;
      auVar105._0_8_ = *(ulong *)((long)in + lVar38 + 0x360);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = *(ulong *)((long)in + lVar38 + 0x240);
      auVar44 = vpunpcklqdq_avx(auVar105,auVar117);
      auVar108._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
      auVar108._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
      auVar98 = vpsubw_avx2(auVar108,auVar102);
      auVar47 = vpabsw_avx2(auVar98);
      auVar58 = vpsrlw_avx2(auVar47,ZEXT416(uVar39));
      auVar58 = vpsubusw_avx2(auVar48,auVar58);
      auVar47 = vpminsw_avx2(auVar47,auVar58);
      auVar58 = vpsraw_avx2(auVar98,0xf);
      auVar47 = vpaddw_avx2(auVar58,auVar47);
      auVar47 = vpaddw_avx2(auVar99 ^ auVar95,auVar58 ^ auVar47);
      auVar47 = vpaddw_avx2(auVar4,auVar47);
      auVar98._8_2_ = 1;
      auVar98._0_8_ = 0x1000100010001;
      auVar98._10_2_ = 1;
      auVar98._12_2_ = 1;
      auVar98._14_2_ = 1;
      auVar98._16_2_ = 1;
      auVar98._18_2_ = 1;
      auVar98._20_2_ = 1;
      auVar98._22_2_ = 1;
      auVar98._24_2_ = 1;
      auVar98._26_2_ = 1;
      auVar98._28_2_ = 1;
      auVar98._30_2_ = 1;
      auVar47 = vpmullw_avx2(auVar47,auVar98);
      auVar47 = vpaddw_avx2(auVar47,auVar3);
      auVar3 = vpmaxub_avx2(auVar123,auVar125);
      auVar4._16_8_ = uVar128;
      auVar4._0_16_ = auVar127;
      auVar4._24_8_ = uVar129;
      auVar4 = vpmaxub_avx2(auVar4,auVar132);
      auVar3 = vpmaxub_avx2(auVar3,auVar4);
      auVar4 = vpmaxub_avx2(auVar60,auVar101);
      auVar4 = vpmaxub_avx2(auVar4,auVar85);
      auVar95 = vpmaxub_avx2(auVar3,auVar4);
      auVar58._8_2_ = 0xbfff;
      auVar58._0_8_ = 0xbfffbfffbfffbfff;
      auVar58._10_2_ = 0xbfff;
      auVar58._12_2_ = 0xbfff;
      auVar58._14_2_ = 0xbfff;
      auVar58._16_2_ = 0xbfff;
      auVar58._18_2_ = 0xbfff;
      auVar58._20_2_ = 0xbfff;
      auVar58._22_2_ = 0xbfff;
      auVar58._24_2_ = 0xbfff;
      auVar58._26_2_ = 0xbfff;
      auVar58._28_2_ = 0xbfff;
      auVar58._30_2_ = 0xbfff;
      auVar3 = vpand_avx2(auVar58,auVar94);
      auVar4 = vpmaxsw_avx2(auVar102,auVar3);
      auVar3 = vpmaxub_avx2(auVar108,auVar95);
      auVar3 = vpand_avx2(auVar58,auVar3);
      auVar3 = vpmaxsw_avx2(auVar4,auVar3);
      auVar4 = vpminsw_avx2(auVar123,auVar107);
      auVar4 = vpminsw_avx2(auVar125,auVar4);
      auVar4 = vpminsw_avx2(auVar4,auVar118);
      auVar95._16_8_ = uVar128;
      auVar95._0_16_ = auVar127;
      auVar95._24_8_ = uVar129;
      auVar95 = vpminsw_avx2(auVar95,auVar132);
      auVar95 = vpminsw_avx2(auVar95,auVar60);
      auVar95 = vpminsw_avx2(auVar95,auVar101);
      auVar4 = vpminsw_avx2(auVar4,auVar95);
      auVar95 = vpminsw_avx2(auVar108,auVar85);
      auVar4 = vpminsw_avx2(auVar4,auVar95);
      auVar95 = vpsraw_avx2(auVar47,0xf);
      auVar94._8_2_ = 8;
      auVar94._0_8_ = 0x8000800080008;
      auVar94._10_2_ = 8;
      auVar94._12_2_ = 8;
      auVar94._14_2_ = 8;
      auVar94._16_2_ = 8;
      auVar94._18_2_ = 8;
      auVar94._20_2_ = 8;
      auVar94._22_2_ = 8;
      auVar94._24_2_ = 8;
      auVar94._26_2_ = 8;
      auVar94._28_2_ = 8;
      auVar94._30_2_ = 8;
      auVar47 = vpaddw_avx2(auVar47,auVar94);
      auVar47 = vpaddw_avx2(auVar47,auVar95);
      auVar47 = vpsraw_avx2(auVar47,4);
      auVar47 = vpaddw_avx2(auVar102,auVar47);
      auVar47 = vpmaxsw_avx2(auVar47,auVar4);
      auVar47 = vpminsw_avx2(auVar47,auVar3);
      auVar47 = vpackuswb_avx2(auVar47,auVar47);
      *(int *)dest = auVar47._20_4_;
      *(int *)((long)dest + lVar31) = auVar47._16_4_;
      *(int *)((long)dest + lVar31 * 2) = auVar47._4_4_;
      *(int *)((long)dest + lVar31 * 3) = auVar47._0_4_;
      dest = (void *)((long)dest + lVar31 * 4);
      in = (uint16_t *)((long)in + 0x480);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_0)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  }
}